

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O2

void lsp::LanguageService::toClient_request_workspace_configuration(void)

{
  element_type *this;
  uint32_t id_00;
  initializer_list<lsp::types::ConfigurationItem> __l;
  allocator<char> local_199;
  json paramsjson;
  Id id;
  code *local_e0 [2];
  code *local_d0;
  code *local_c8;
  Request request;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&request,"arxmlNavigationHelper",(allocator<char> *)&id);
  __l._M_len = 1;
  __l._M_array = (iterator)&request;
  std::vector<lsp::types::ConfigurationItem,_std::allocator<lsp::types::ConfigurationItem>_>::vector
            ((vector<lsp::types::ConfigurationItem,_std::allocator<lsp::types::ConfigurationItem>_>
              *)&stack0xfffffffffffffe98,__l,(allocator_type *)&stack0xfffffffffffffe68);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<lsp::types::ConfigurationParams,_lsp::types::ConfigurationParams,_0>
            (&paramsjson,(ConfigurationParams *)&stack0xfffffffffffffe98);
  std::vector<lsp::types::ConfigurationItem,_std::allocator<lsp::types::ConfigurationItem>_>::
  ~vector((vector<lsp::types::ConfigurationItem,_std::allocator<lsp::types::ConfigurationItem>_> *)
          &stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&request);
  id_00 = getNextRequestID::id;
  getNextRequestID::id = getNextRequestID::id + 1;
  jsonrpcpp::Id::Id(&id,id_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe68,"workspace/configuration",&local_199);
  jsonrpcpp::Parameter::Parameter((Parameter *)&stack0xfffffffffffffe98,&paramsjson);
  jsonrpcpp::Request::Request
            (&request,&id,(string *)&stack0xfffffffffffffe68,(Parameter *)&stack0xfffffffffffffe98);
  jsonrpcpp::Parameter::~Parameter((Parameter *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  this = ioHandler_.super___shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  jsonrpcpp::Request::to_json_abi_cxx11_((Request *)&stack0xfffffffffffffe68);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump((string_t *)&stack0xfffffffffffffe98,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)&stack0xfffffffffffffe68,-1,' ',false,strict);
  IOHandler::addMessageToSend(this,(string *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&stack0xfffffffffffffe68);
  local_e0[1] = (code *)0x0;
  local_e0[0] = response_workspace_configuration;
  local_c8 = std::
             _Function_handler<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&),_void_(*)(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
             ::_M_invoke;
  local_d0 = std::
             _Function_handler<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&),_void_(*)(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
             ::_M_manager;
  MessageParser::register_response_callback
            (messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,id.super_Entity._12_4_,(response_callback *)local_e0);
  std::_Function_base::~_Function_base((_Function_base *)local_e0);
  jsonrpcpp::Request::~Request(&request);
  jsonrpcpp::Id::~Id(&id);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&paramsjson);
  return;
}

Assistant:

void lsp::LanguageService::toClient_request_workspace_configuration()
{
    json paramsjson = lsp::types::ConfigurationParams{std::vector<lsp::types::ConfigurationItem>{{"arxmlNavigationHelper"}}};
    jsonrpcpp::Id id(getNextRequestID());
    jsonrpcpp::Request request(id, "workspace/configuration", paramsjson);
    ioHandler_->addMessageToSend(request.to_json().dump());
    messageParser_->register_response_callback(id.int_id(), response_workspace_configuration);
}